

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopStyleVar(int count)

{
  ImVector<ImGuiStyleMod> *this;
  ImGuiContext *pIVar1;
  ImGuiStyleMod *pIVar2;
  ImGuiStyleVarInfo *pIVar3;
  ulong uVar4;
  
  pIVar1 = GImGui;
  this = &GImGui->StyleVarStack;
  for (; 0 < count; count = count + -1) {
    pIVar2 = ImVector<ImGuiStyleMod>::back(this);
    pIVar3 = GetStyleVarInfo(pIVar2->VarIdx);
    if (pIVar3->Type == 8) {
      uVar4 = (ulong)pIVar3->Offset;
      if (pIVar3->Count == 2) {
        *(int *)((long)&(pIVar1->Style).Alpha + uVar4) = (pIVar2->field_1).BackupInt[0];
        *(int *)((long)&(pIVar1->Style).WindowPadding.x + uVar4) = (pIVar2->field_1).BackupInt[1];
      }
      else if (pIVar3->Count == 1) {
        *(int *)((long)&(pIVar1->Style).Alpha + uVar4) = (pIVar2->field_1).BackupInt[0];
      }
    }
    ImVector<ImGuiStyleMod>::pop_back(this);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleVarStack.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleVarStack.pop_back();
        count--;
    }
}